

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O3

void secp256k1_fe_cmov(secp256k1_fe *r,secp256k1_fe *a,int flag)

{
  secp256k1_fe *r_00;
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  secp256k1_modinv64_modinfo *psVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  secp256k1_gej *psVar14;
  secp256k1_gej *psVar15;
  secp256k1_gej *a_00;
  secp256k1_gej *psVar16;
  secp256k1_gej *a_01;
  secp256k1_gej *psVar17;
  ulong uVar18;
  uint64_t *puVar19;
  ulong uVar20;
  uint64_t *puVar21;
  long lVar22;
  long lVar23;
  undefined1 *puVar24;
  secp256k1_gej *psVar25;
  undefined1 *unaff_R13;
  ulong uVar26;
  secp256k1_modinv64_modinfo *psVar27;
  secp256k1_modinv64_modinfo *psVar28;
  secp256k1_modinv64_modinfo *modinfo;
  bool bVar29;
  undefined1 auVar30 [16];
  int vflag;
  unsigned_long _zzq_result;
  unsigned_long _zzq_args [6];
  secp256k1_strauss_state sStack_ca8;
  secp256k1_gej sStack_c90;
  secp256k1_fe asStack_bf8 [8];
  secp256k1_ge asStack_a78 [8];
  secp256k1_strauss_point_state sStack_738;
  ulong uStack_328;
  secp256k1_gej *psStack_320;
  secp256k1_modinv64_modinfo *psStack_318;
  secp256k1_gej *psStack_308;
  secp256k1_modinv64_modinfo *psStack_300;
  ulong uStack_2f8;
  secp256k1_gej *psStack_2f0;
  ulong uStack_2e8;
  ulong uStack_2e0;
  ulong uStack_2d8;
  secp256k1_modinv64_modinfo *psStack_2d0;
  ulong uStack_2c8;
  secp256k1_modinv64_modinfo *psStack_2c0;
  ulong uStack_2b8;
  undefined1 auStack_2b0 [48];
  secp256k1_modinv64_modinfo *psStack_280;
  ulong uStack_278;
  ulong uStack_270;
  secp256k1_gej *psStack_268;
  undefined1 auStack_260 [56];
  ulong uStack_228;
  ulong uStack_220;
  secp256k1_gej *psStack_218;
  undefined1 auStack_210 [96];
  secp256k1_gej *psStack_1b0;
  undefined1 *puStack_1a8;
  secp256k1_gej *psStack_1a0;
  secp256k1_modinv64_modinfo *psStack_198;
  code *pcStack_190;
  secp256k1_gej *psStack_188;
  secp256k1_gej *psStack_178;
  undefined1 auStack_168 [152];
  undefined8 uStack_d0;
  secp256k1_fe sStack_a8;
  
  if ((uint)flag < 2) {
    secp256k1_fe_verify(a);
    secp256k1_fe_verify(r);
    uVar7 = (long)flag - 1;
    uVar6 = -(long)flag;
    r->n[0] = a->n[0] & uVar6 | r->n[0] & uVar7;
    r->n[1] = a->n[1] & uVar6 | r->n[1] & uVar7;
    r->n[2] = a->n[2] & uVar6 | r->n[2] & uVar7;
    r->n[3] = a->n[3] & uVar6 | r->n[3] & uVar7;
    r->n[4] = uVar6 & a->n[4] | uVar7 & r->n[4];
    if (r->magnitude < a->magnitude) {
      r->magnitude = a->magnitude;
    }
    if (a->normalized == 0) {
      r->normalized = 0;
    }
    secp256k1_fe_verify(r);
    return;
  }
  secp256k1_fe_cmov_cold_1();
  psVar25 = (secp256k1_gej *)0x1000003d0;
  secp256k1_gej_verify((secp256k1_gej *)r);
  secp256k1_fe_verify(a);
  secp256k1_fe_verify(a);
  uVar7 = (a->n[4] >> 0x30) * 0x1000003d1 + a->n[0];
  if (((uVar7 & 0xfffffffffffff) != 0xffffefffffc2f) && ((uVar7 & 0xfffffffffffff) != 0)) {
LAB_0014b9e1:
    secp256k1_fe_sqr(&sStack_a8,a);
    secp256k1_fe_mul(r,r,&sStack_a8);
    r_00 = &((secp256k1_gej *)r)->y;
    secp256k1_fe_mul(r_00,r_00,&sStack_a8);
    secp256k1_fe_mul(r_00,r_00,a);
    secp256k1_fe_mul(&((secp256k1_gej *)r)->z,&((secp256k1_gej *)r)->z,a);
    secp256k1_gej_verify((secp256k1_gej *)r);
    return;
  }
  uVar6 = (uVar7 >> 0x34) + a->n[1];
  psVar14 = (secp256k1_gej *)((uVar6 >> 0x34) + a->n[2]);
  psVar16 = (secp256k1_gej *)(((ulong)psVar14 >> 0x34) + a->n[3]);
  uVar18 = ((ulong)psVar16 >> 0x34) + (a->n[4] & 0xffffffffffff);
  if ((((uVar6 | uVar7 | (ulong)psVar14 | (ulong)psVar16) & 0xfffffffffffff) != 0 || uVar18 != 0) &&
     (((uVar7 | 0x1000003d0) & uVar6 & (ulong)psVar14 & (ulong)psVar16 & (uVar18 ^ 0xf000000000000))
      != 0xfffffffffffff)) goto LAB_0014b9e1;
  secp256k1_gej_rescale_cold_1();
  uStack_d0 = 0x1000003d0;
  a_00 = (secp256k1_gej *)auStack_168;
  a_01 = (secp256k1_gej *)auStack_168;
  modinfo = (secp256k1_modinv64_modinfo *)auStack_168;
  auStack_168._144_8_ = r;
  secp256k1_gej_verify(psVar14);
  psVar16->infinity = psVar14->infinity;
  secp256k1_fe_mul(&psVar16->z,&psVar14->z,&psVar14->y);
  secp256k1_fe_sqr((secp256k1_fe *)auStack_168,&psVar14->y);
  psVar17 = (secp256k1_gej *)(auStack_168 + 0x60);
  psVar15 = psVar14;
  secp256k1_fe_sqr((secp256k1_fe *)psVar17,&psVar14->x);
  secp256k1_fe_verify((secp256k1_fe *)psVar17);
  if ((int)auStack_168._136_4_ < 0xb) {
    auStack_168._136_4_ = auStack_168._136_4_ * 3;
    psVar15 = (secp256k1_gej *)(auStack_168 + 0x60);
    auStack_168._96_8_ = auStack_168._96_8_ * 3;
    auStack_168._104_8_ = auStack_168._104_8_ * 3;
    auStack_168._112_8_ = auStack_168._112_8_ * 3;
    auStack_168._120_8_ = auStack_168._120_8_ * 3;
    auStack_168._128_8_ = auStack_168._128_8_ * 3;
    auStack_168._140_4_ = 0;
    secp256k1_fe_verify((secp256k1_fe *)psVar15);
    secp256k1_fe_half((secp256k1_fe *)psVar15);
    secp256k1_fe_verify((secp256k1_fe *)auStack_168);
    secp256k1_fe_verify_magnitude((secp256k1_fe *)auStack_168,1);
    auStack_168._48_8_ = 0x3ffffbfffff0bc - auStack_168._0_8_;
    auStack_168._56_8_ = 0x3ffffffffffffc - auStack_168._8_8_;
    psVar25 = (secp256k1_gej *)(auStack_168 + 0x30);
    auStack_168._64_8_ = 0x3ffffffffffffc - auStack_168._16_8_;
    auStack_168._72_8_ = 0x3ffffffffffffc - auStack_168._24_8_;
    auStack_168._80_8_ = 0x3fffffffffffc - auStack_168._32_8_;
    auStack_168._88_8_ = 2;
    secp256k1_fe_verify((secp256k1_fe *)psVar25);
    secp256k1_fe_mul((secp256k1_fe *)psVar25,(secp256k1_fe *)psVar25,&psVar14->x);
    secp256k1_fe_sqr(&psVar16->x,(secp256k1_fe *)psVar15);
    secp256k1_fe_verify(&psVar16->x);
    psVar17 = psVar25;
    secp256k1_fe_verify((secp256k1_fe *)psVar25);
    iVar4 = auStack_168._88_4_ + (psVar16->x).magnitude;
    unaff_R13 = auStack_168;
    if (0x20 < iVar4) goto LAB_0014bdad;
    uVar1 = (psVar16->x).n[1];
    uVar2 = (psVar16->x).n[2];
    uVar3 = (psVar16->x).n[3];
    psVar14 = (secp256k1_gej *)(auStack_168 + 0x30);
    (psVar16->x).n[0] = (psVar16->x).n[0] + auStack_168._48_8_;
    (psVar16->x).n[1] = uVar1 + auStack_168._56_8_;
    (psVar16->x).n[2] = uVar2 + auStack_168._64_8_;
    (psVar16->x).n[3] = uVar3 + auStack_168._72_8_;
    puVar19 = (psVar16->x).n + 4;
    *puVar19 = *puVar19 + auStack_168._80_8_;
    (psVar16->x).magnitude = iVar4;
    (psVar16->x).normalized = 0;
    secp256k1_fe_verify(&psVar16->x);
    secp256k1_fe_verify(&psVar16->x);
    psVar17 = psVar14;
    secp256k1_fe_verify((secp256k1_fe *)psVar14);
    iVar4 = auStack_168._88_4_ + (psVar16->x).magnitude;
    unaff_R13 = auStack_168;
    if (0x20 < iVar4) goto LAB_0014bdb2;
    uVar1 = (psVar16->x).n[1];
    uVar2 = (psVar16->x).n[2];
    uVar3 = (psVar16->x).n[3];
    psVar14 = (secp256k1_gej *)(auStack_168 + 0x30);
    (psVar16->x).n[0] = (psVar16->x).n[0] + auStack_168._48_8_;
    (psVar16->x).n[1] = uVar1 + auStack_168._56_8_;
    (psVar16->x).n[2] = uVar2 + auStack_168._64_8_;
    (psVar16->x).n[3] = uVar3 + auStack_168._72_8_;
    puVar19 = (psVar16->x).n + 4;
    *puVar19 = *puVar19 + auStack_168._80_8_;
    (psVar16->x).magnitude = iVar4;
    (psVar16->x).normalized = 0;
    secp256k1_fe_verify(&psVar16->x);
    secp256k1_fe_sqr((secp256k1_fe *)auStack_168,(secp256k1_fe *)auStack_168);
    secp256k1_fe_verify((secp256k1_fe *)psVar14);
    psVar17 = psVar16;
    secp256k1_fe_verify(&psVar16->x);
    uVar5 = (psVar16->x).magnitude + auStack_168._88_4_;
    unaff_R13 = auStack_168;
    if (0x20 < (int)uVar5) goto LAB_0014bdb7;
    a_00 = (secp256k1_gej *)(auStack_168 + 0x30);
    auStack_168._48_8_ = (psVar16->x).n[0] + auStack_168._48_8_;
    auStack_168._56_8_ = (psVar16->x).n[1] + auStack_168._56_8_;
    auStack_168._64_8_ = (psVar16->x).n[2] + auStack_168._64_8_;
    auStack_168._72_8_ = (psVar16->x).n[3] + auStack_168._72_8_;
    auStack_168._80_8_ = auStack_168._80_8_ + (psVar16->x).n[4];
    auStack_168._92_4_ = 0;
    auStack_168._88_4_ = uVar5;
    secp256k1_fe_verify((secp256k1_fe *)a_00);
    psVar14 = (secp256k1_gej *)&psVar16->y;
    secp256k1_fe_mul((secp256k1_fe *)psVar14,(secp256k1_fe *)a_00,
                     (secp256k1_fe *)(auStack_168 + 0x60));
    secp256k1_fe_verify((secp256k1_fe *)psVar14);
    secp256k1_fe_verify((secp256k1_fe *)auStack_168);
    iVar4 = auStack_168._40_4_ + (psVar16->y).magnitude;
    unaff_R13 = auStack_168;
    if (iVar4 < 0x21) {
      uVar1 = (psVar16->y).n[1];
      uVar2 = (psVar16->y).n[2];
      uVar3 = (psVar16->y).n[3];
      (psVar16->y).n[0] = (psVar16->y).n[0] + auStack_168._0_8_;
      (psVar16->y).n[1] = uVar1 + auStack_168._8_8_;
      (psVar16->y).n[2] = uVar2 + auStack_168._16_8_;
      (psVar16->y).n[3] = uVar3 + auStack_168._24_8_;
      puVar19 = (psVar16->y).n + 4;
      *puVar19 = *puVar19 + auStack_168._32_8_;
      (psVar16->y).magnitude = iVar4;
      (psVar16->y).normalized = 0;
      secp256k1_fe_verify((secp256k1_fe *)psVar14);
      secp256k1_fe_verify((secp256k1_fe *)psVar14);
      secp256k1_fe_verify_magnitude((secp256k1_fe *)psVar14,2);
      uVar1 = (psVar16->y).n[1];
      uVar2 = (psVar16->y).n[2];
      uVar3 = (psVar16->y).n[3];
      (psVar16->y).n[0] = 0x5ffff9ffffe91a - (psVar16->y).n[0];
      (psVar16->y).n[1] = 0x5ffffffffffffa - uVar1;
      (psVar16->y).n[2] = 0x5ffffffffffffa - uVar2;
      (psVar16->y).n[3] = 0x5ffffffffffffa - uVar3;
      (psVar16->y).n[4] = 0x5fffffffffffa - (psVar16->y).n[4];
      (psVar16->y).magnitude = 3;
      (psVar16->y).normalized = 0;
      secp256k1_fe_verify((secp256k1_fe *)psVar14);
      secp256k1_gej_verify(psVar16);
      return;
    }
  }
  else {
    secp256k1_gej_double_cold_5();
LAB_0014bdad:
    secp256k1_gej_double_cold_4();
LAB_0014bdb2:
    a_00 = psVar15;
    secp256k1_gej_double_cold_3();
LAB_0014bdb7:
    a_01 = psVar17;
    modinfo = (secp256k1_modinv64_modinfo *)(auStack_168 + 0x60);
    secp256k1_gej_double_cold_2();
  }
  secp256k1_gej_double_cold_1();
  uVar7 = (ulong)a_00 & 0xffffffff;
  psStack_188 = (secp256k1_gej *)0x14bdce;
  psVar17 = a_01;
  psStack_178 = psVar16;
  secp256k1_fe_verify(&a_01->x);
  if ((uint)a_00 < 0x21) {
    iVar4 = (a_01->x).magnitude * (uint)a_00;
    if (iVar4 < 0x21) {
      (a_01->x).n[0] = (a_01->x).n[0] * uVar7;
      (a_01->x).n[1] = (a_01->x).n[1] * uVar7;
      (a_01->x).n[2] = (a_01->x).n[2] * uVar7;
      (a_01->x).n[3] = (a_01->x).n[3] * uVar7;
      (a_01->x).n[4] = uVar7 * (a_01->x).n[4];
      (a_01->x).magnitude = iVar4;
      (a_01->x).normalized = 0;
      secp256k1_fe_verify(&a_01->x);
      return;
    }
  }
  else {
    psStack_188 = (secp256k1_gej *)0x14be34;
    secp256k1_fe_mul_int_unchecked_cold_2();
  }
  psStack_188 = (secp256k1_gej *)secp256k1_fe_half;
  secp256k1_fe_mul_int_unchecked_cold_1();
  pcStack_190 = (code *)0x14be42;
  psStack_188 = a_01;
  secp256k1_fe_verify(&psVar17->x);
  pcStack_190 = (code *)0x14be4f;
  psVar16 = psVar17;
  secp256k1_fe_verify_magnitude(&psVar17->x,0x1f);
  psVar8 = (secp256k1_modinv64_modinfo *)(psVar17->x).n[0];
  uVar6 = -(ulong)((uint)psVar8 & 1);
  uVar18 = uVar6 >> 0xc;
  uVar13 = (long)(psVar8->modulus).v + (uVar18 & 0xffffefffffc2f);
  if ((uVar13 & 1) == 0) {
    uVar7 = (uVar6 >> 0x10) + (psVar17->x).n[4];
    uVar9 = uVar18 + (psVar17->x).n[3];
    uVar5 = (uint)(uVar6 >> 0x2c);
    auVar30._0_8_ = CONCAT44(uVar5,(int)uVar18);
    auVar30._8_4_ = (int)uVar18;
    auVar30._12_4_ = uVar5;
    uVar6 = auVar30._0_8_ + (psVar17->x).n[1];
    uVar18 = auVar30._8_8_ + (psVar17->x).n[2];
    (psVar17->x).n[0] = ((ulong)((uint)uVar6 & 1) << 0x33) + (uVar13 >> 1);
    (psVar17->x).n[1] = ((uVar18 & 1) << 0x33) + (uVar6 >> 1);
    (psVar17->x).n[2] = ((uVar9 & 1) << 0x33) + (uVar18 >> 1);
    (psVar17->x).n[3] = ((ulong)((uint)uVar7 & 1) << 0x33) + (uVar9 >> 1);
    (psVar17->x).n[4] = uVar7 >> 1;
    (psVar17->x).magnitude = ((psVar17->x).magnitude >> 1) + 1;
    (psVar17->x).normalized = 0;
    secp256k1_fe_verify(&psVar17->x);
    return;
  }
  pcStack_190 = secp256k1_modinv64;
  secp256k1_fe_half_cold_1();
  uVar9 = 0;
  auStack_210._16_8_ = 0;
  auStack_210._24_8_ = 0;
  auStack_210._0_8_ = 0;
  auStack_210._8_8_ = 0;
  auStack_210._32_8_ = 0;
  auStack_210._72_8_ = 0;
  auStack_210._80_8_ = 0;
  auStack_210._56_8_ = 0;
  auStack_210._64_8_ = 0;
  auStack_210._48_8_ = 1;
  uStack_2f8 = (psVar8->modulus).v[4];
  auStack_2b0._0_8_ = (psVar8->modulus).v[0];
  uStack_2c8 = (psVar8->modulus).v[1];
  uStack_2e0 = (psVar8->modulus).v[2];
  uVar6 = (psVar8->modulus).v[3];
  auStack_260._0_8_ = (psVar16->x).n[0];
  psStack_2c0 = (secp256k1_modinv64_modinfo *)(psVar16->x).n[1];
  psStack_2d0 = (secp256k1_modinv64_modinfo *)(psVar16->x).n[2];
  uStack_2e8 = (psVar16->x).n[3];
  auStack_260._32_8_ = (psVar16->x).n[4];
  uVar13 = 0xffffffffffffffff;
  psVar27 = (secp256k1_modinv64_modinfo *)auStack_260._0_8_;
  uVar18 = auStack_2b0._0_8_;
  psStack_300 = psVar8;
  psStack_2f0 = (secp256k1_gej *)auStack_260._32_8_;
  auStack_2b0._8_8_ = uStack_2c8;
  auStack_2b0._16_8_ = uStack_2e0;
  auStack_2b0._24_8_ = uVar6;
  auStack_2b0._32_8_ = uStack_2f8;
  auStack_2b0._40_8_ = psVar16;
  auStack_260._8_8_ = psStack_2c0;
  auStack_260._16_8_ = psStack_2d0;
  auStack_260._24_8_ = uStack_2e8;
  auStack_210._88_8_ = psVar17;
  psStack_1b0 = psVar25;
  puStack_1a8 = unaff_R13;
  psStack_1a0 = psVar14;
  psStack_198 = modinfo;
  pcStack_190 = (code *)uVar7;
  do {
    psVar25 = (secp256k1_gej *)0x8;
    lVar10 = 3;
    uVar7 = 0;
    uVar26 = 0;
    psVar14 = (secp256k1_gej *)0x8;
    psStack_308 = (secp256k1_gej *)0x8;
    psVar8 = psVar27;
    uVar11 = uVar18;
    psVar17 = psVar16;
    psVar28 = modinfo;
    do {
      uStack_2b8 = uVar6;
      if ((uVar11 & 1) == 0) {
        psStack_318 = (secp256k1_modinv64_modinfo *)0x14c974;
        secp256k1_modinv64_cold_29();
LAB_0014c974:
        psStack_318 = (secp256k1_modinv64_modinfo *)0x14c979;
        secp256k1_modinv64_cold_1();
LAB_0014c979:
        psStack_318 = (secp256k1_modinv64_modinfo *)0x14c97e;
        secp256k1_modinv64_cold_2();
LAB_0014c97e:
        psStack_318 = (secp256k1_modinv64_modinfo *)0x14c983;
        secp256k1_modinv64_cold_28();
        goto LAB_0014c983;
      }
      psVar17 = (secp256k1_gej *)(uVar7 * (long)psVar27 + (long)psVar25 * uVar18);
      psVar14 = (secp256k1_gej *)(uVar11 << ((byte)lVar10 & 0x3f));
      if (psVar17 != psVar14) goto LAB_0014c974;
      psVar17 = (secp256k1_gej *)((long)psStack_308 * (long)psVar27 + uVar26 * uVar18);
      psVar14 = (secp256k1_gej *)((long)psVar8 << ((byte)lVar10 & 0x3f));
      if (psVar17 != psVar14) goto LAB_0014c979;
      psVar14 = (secp256k1_gej *)((long)uVar13 >> 0x3f);
      uStack_270 = (ulong)((uint)psVar8 & 1);
      uVar20 = -uStack_270;
      psVar17 = (secp256k1_gej *)((ulong)psVar14 & uVar20);
      uVar13 = uVar13 ^ (ulong)psVar17;
      psVar28 = psVar27;
      psStack_268 = psVar14;
      if (uVar13 - 0x251 < 0xfffffffffffffb61) goto LAB_0014c97e;
      uVar13 = uVar13 - 1;
      psVar16 = (secp256k1_gej *)
                ((long)(psStack_308->x).n + (((ulong)psVar14 ^ uVar7) - (long)psVar14 & uVar20));
      uVar7 = (uVar7 + ((ulong)psVar16 & (ulong)psVar17)) * 2;
      uVar26 = uVar26 + (((ulong)psVar14 ^ (ulong)psVar25) - (long)psVar14 & uVar20);
      psVar25 = (secp256k1_gej *)(((long)(psVar25->x).n + (uVar26 & (ulong)psVar17)) * 2);
      puVar24 = (undefined1 *)
                ((long)(psVar8->modulus).v + (((ulong)psVar14 ^ uVar11) - (long)psVar14 & uVar20));
      psVar8 = (secp256k1_modinv64_modinfo *)((ulong)puVar24 >> 1);
      uVar11 = uVar11 + ((ulong)puVar24 & (ulong)psVar17);
      lVar10 = lVar10 + 1;
      psStack_308 = psVar16;
    } while (lVar10 != 0x3e);
    psVar14 = (secp256k1_gej *)(uVar7 * uVar26);
    modinfo = psVar27;
    uStack_2d8 = uVar18;
    uStack_278 = uVar9;
    auStack_260._48_8_ = psVar25;
    uStack_228 = uVar7;
    uStack_220 = uVar26;
    psStack_218 = psVar16;
    if ((SUB168(SEXT816((long)psVar25) * SEXT816((long)psVar16),8) -
        SUB168(SEXT816((long)uVar7) * SEXT816((long)uVar26),8)) -
        (ulong)((secp256k1_gej *)((long)psVar25 * (long)psVar16) < psVar14) != 2 ||
        (long)psVar25 * (long)psVar16 - (long)psVar14 != 0) goto LAB_0014c9fb;
    psStack_318 = (secp256k1_modinv64_modinfo *)0x14c189;
    secp256k1_modinv64_update_de_62
              ((secp256k1_modinv64_signed62 *)auStack_210,
               (secp256k1_modinv64_signed62 *)(auStack_210 + 0x30),
               (secp256k1_modinv64_trans2x2 *)(auStack_260 + 0x30),psStack_300);
    psVar15 = (secp256k1_gej *)auStack_2b0;
    psVar14 = (secp256k1_gej *)0x5;
    psStack_318 = (secp256k1_modinv64_modinfo *)0x14c1a7;
    psVar17 = psVar15;
    iVar4 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar15,5,&psStack_300->modulus,-1);
    if (iVar4 < 1) {
LAB_0014c983:
      psVar15 = psVar17;
      psStack_318 = (secp256k1_modinv64_modinfo *)0x14c988;
      secp256k1_modinv64_cold_27();
LAB_0014c988:
      psStack_318 = (secp256k1_modinv64_modinfo *)0x14c98d;
      secp256k1_modinv64_cold_26();
LAB_0014c98d:
      psVar16 = psVar15;
      psStack_318 = (secp256k1_modinv64_modinfo *)0x14c992;
      secp256k1_modinv64_cold_25();
LAB_0014c992:
      psStack_318 = (secp256k1_modinv64_modinfo *)0x14c997;
      secp256k1_modinv64_cold_24();
LAB_0014c997:
      psStack_318 = (secp256k1_modinv64_modinfo *)0x14c99c;
      secp256k1_modinv64_cold_4();
LAB_0014c99c:
      psStack_318 = (secp256k1_modinv64_modinfo *)0x14c9a1;
      secp256k1_modinv64_cold_5();
      psVar27 = psVar28;
LAB_0014c9a1:
      psStack_318 = (secp256k1_modinv64_modinfo *)0x14c9a6;
      secp256k1_modinv64_cold_21();
LAB_0014c9a6:
      psStack_318 = (secp256k1_modinv64_modinfo *)0x14c9ab;
      secp256k1_modinv64_cold_20();
LAB_0014c9ab:
      psStack_318 = (secp256k1_modinv64_modinfo *)0x14c9b0;
      secp256k1_modinv64_cold_19();
LAB_0014c9b0:
      psStack_318 = (secp256k1_modinv64_modinfo *)0x14c9b5;
      secp256k1_modinv64_cold_18();
LAB_0014c9b5:
      psStack_318 = (secp256k1_modinv64_modinfo *)0x14c9ba;
      secp256k1_modinv64_cold_17();
LAB_0014c9ba:
      psStack_318 = (secp256k1_modinv64_modinfo *)0x14c9bf;
      secp256k1_modinv64_cold_16();
LAB_0014c9bf:
      psStack_318 = (secp256k1_modinv64_modinfo *)0x14c9c4;
      secp256k1_modinv64_cold_15();
      modinfo = psVar27;
LAB_0014c9c4:
      psStack_318 = (secp256k1_modinv64_modinfo *)0x14c9c9;
      secp256k1_modinv64_cold_14();
LAB_0014c9c9:
      psStack_318 = (secp256k1_modinv64_modinfo *)0x14c9ce;
      secp256k1_modinv64_cold_13();
LAB_0014c9ce:
      psStack_318 = (secp256k1_modinv64_modinfo *)0x14c9d3;
      secp256k1_modinv64_cold_12();
LAB_0014c9d3:
      psVar17 = psVar16;
      psStack_318 = (secp256k1_modinv64_modinfo *)0x14c9d8;
      secp256k1_modinv64_cold_11();
LAB_0014c9d8:
      psStack_318 = (secp256k1_modinv64_modinfo *)0x14c9dd;
      secp256k1_modinv64_cold_10();
LAB_0014c9dd:
      psVar16 = psVar17;
      psStack_318 = (secp256k1_modinv64_modinfo *)0x14c9e2;
      secp256k1_modinv64_cold_9();
LAB_0014c9e2:
      psStack_318 = (secp256k1_modinv64_modinfo *)0x14c9e7;
      secp256k1_modinv64_cold_8();
      psVar27 = modinfo;
LAB_0014c9e7:
      psStack_318 = (secp256k1_modinv64_modinfo *)0x14c9ec;
      secp256k1_modinv64_cold_23();
LAB_0014c9ec:
      modinfo = psVar27;
      psStack_318 = (secp256k1_modinv64_modinfo *)0x14c9f1;
      secp256k1_modinv64_cold_22();
      goto LAB_0014c9f1;
    }
    psVar14 = (secp256k1_gej *)0x5;
    psStack_318 = (secp256k1_modinv64_modinfo *)0x14c1c6;
    iVar4 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar15,5,&psStack_300->modulus,1);
    if (0 < iVar4) goto LAB_0014c988;
    psVar16 = (secp256k1_gej *)auStack_260;
    psVar14 = (secp256k1_gej *)0x5;
    psStack_318 = (secp256k1_modinv64_modinfo *)0x14c1ef;
    psVar15 = psVar16;
    iVar4 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar16,5,&psStack_300->modulus,-1);
    if (iVar4 < 1) goto LAB_0014c98d;
    psVar14 = (secp256k1_gej *)0x5;
    psStack_318 = (secp256k1_modinv64_modinfo *)0x14c20e;
    iVar4 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar16,5,&psStack_300->modulus,1);
    modinfo = psStack_300;
    if (-1 < iVar4) goto LAB_0014c992;
    psVar14 = (secp256k1_gej *)((long)psVar25 * uStack_2d8);
    lVar10 = SUB168(SEXT816((long)psVar25) * SEXT816((long)uStack_2d8),8);
    uVar6 = uVar7 * (long)psVar27;
    psVar16 = SUB168(SEXT816((long)uVar7) * SEXT816((long)psVar27),8);
    if ((-1 < (long)psVar16) &&
       (uVar18 = (ulong)((secp256k1_gej *)(-1 - uVar6) < psVar14),
       lVar12 = (0x7fffffffffffffff - (long)psVar16) - lVar10,
       (SBORROW8(0x7fffffffffffffff - (long)psVar16,lVar10) != SBORROW8(lVar12,uVar18)) !=
       (long)(lVar12 - uVar18) < 0)) goto LAB_0014c9e7;
    puVar19 = (uint64_t *)((long)(psVar14->x).n + uVar6);
    psVar16 = (secp256k1_gej *)((long)(psVar16->x).n + (ulong)CARRY8(uVar6,(ulong)psVar14) + lVar10)
    ;
    uVar6 = uVar26 * uStack_2d8;
    lVar10 = SUB168(SEXT816((long)uVar26) * SEXT816((long)uStack_2d8),8);
    psVar14 = (secp256k1_gej *)((long)psStack_308 * (long)psVar27);
    lVar12 = SUB168(SEXT816((long)psStack_308) * SEXT816((long)psVar27),8);
    if ((-1 < lVar12) &&
       (uVar18 = (ulong)(-(long)psVar14 - 1U < uVar6),
       lVar23 = (0x7fffffffffffffff - lVar12) - lVar10,
       (SBORROW8(0x7fffffffffffffff - lVar12,lVar10) != SBORROW8(lVar23,uVar18)) !=
       (long)(lVar23 - uVar18) < 0)) goto LAB_0014c9ec;
    bVar29 = CARRY8((ulong)psVar14,uVar6);
    psVar14 = (secp256k1_gej *)((long)(psVar14->x).n + uVar6);
    lVar10 = lVar12 + lVar10 + (ulong)bVar29;
    if (((ulong)puVar19 & 0x3ffffffffffffffe) != 0) goto LAB_0014c997;
    if (((ulong)psVar14 & 0x3fffffffffffffff) != 0) goto LAB_0014c99c;
    uVar6 = (ulong)puVar19 >> 0x3e | (long)psVar16 * 4;
    uVar18 = uStack_2c8 * (long)psVar25 + uVar6;
    lVar12 = SUB168(SEXT816((long)uStack_2c8) * SEXT816((long)psVar25),8) + ((long)psVar16 >> 0x3e)
             + (ulong)CARRY8(uStack_2c8 * (long)psVar25,uVar6);
    uVar6 = (long)psStack_2c0 * uVar7;
    psVar16 = SUB168(SEXT816((long)psStack_2c0) * SEXT816((long)uVar7),8);
    if (-1 < (long)psVar16) {
      uVar9 = (ulong)(-uVar6 - 1 < uVar18);
      lVar23 = (0x7fffffffffffffff - (long)psVar16) - lVar12;
      if ((SBORROW8(0x7fffffffffffffff - (long)psVar16,lVar12) != SBORROW8(lVar23,uVar9)) ==
          (long)(lVar23 - uVar9) < 0) goto LAB_0014c346;
      goto LAB_0014c9a1;
    }
    lVar22 = (-0x8000000000000000 - (long)psVar16) - (ulong)(uVar6 != 0);
    lVar23 = lVar12 - lVar22;
    if ((SBORROW8(lVar12,lVar22) != SBORROW8(lVar23,(ulong)(uVar18 < -uVar6))) !=
        (long)(lVar23 - (ulong)(uVar18 < -uVar6)) < 0) goto LAB_0014c9a1;
LAB_0014c346:
    uVar9 = (ulong)psVar14 >> 0x3e | lVar10 * 4;
    psVar16 = (secp256k1_gej *)((long)(psVar16->x).n + (ulong)CARRY8(uVar6,uVar18) + lVar12);
    uVar11 = uStack_2c8 * uVar26 + uVar9;
    lVar10 = SUB168(SEXT816((long)uStack_2c8) * SEXT816((long)uVar26),8) + (lVar10 >> 0x3e) +
             (ulong)CARRY8(uStack_2c8 * uVar26,uVar9);
    uVar9 = (long)psStack_2c0 * (long)psStack_308;
    psVar14 = SUB168(SEXT816((long)psStack_2c0) * SEXT816((long)psStack_308),8);
    if (-1 < (long)psVar14) {
      uVar20 = (ulong)(-uVar9 - 1 < uVar11);
      lVar12 = (0x7fffffffffffffff - (long)psVar14) - lVar10;
      if ((SBORROW8(0x7fffffffffffffff - (long)psVar14,lVar10) != SBORROW8(lVar12,uVar20)) ==
          (long)(lVar12 - uVar20) < 0) goto LAB_0014c3c6;
      goto LAB_0014c9a6;
    }
    lVar23 = (-0x8000000000000000 - (long)psVar14) - (ulong)(uVar9 != 0);
    lVar12 = lVar10 - lVar23;
    if ((SBORROW8(lVar10,lVar23) != SBORROW8(lVar12,(ulong)(uVar11 < -uVar9))) !=
        (long)(lVar12 - (ulong)(uVar11 < -uVar9)) < 0) goto LAB_0014c9a6;
LAB_0014c3c6:
    psVar14 = (secp256k1_gej *)((long)(psVar14->x).n + (ulong)CARRY8(uVar9,uVar11) + lVar10);
    uVar20 = (long)psVar16 * 4 | uVar6 + uVar18 >> 0x3e;
    uStack_2d8 = uVar6 + uVar18 & 0x3fffffffffffffff;
    psStack_280 = (secp256k1_modinv64_modinfo *)(uVar9 + uVar11 & 0x3fffffffffffffff);
    psVar17 = (secp256k1_gej *)(uStack_2e0 * (long)psVar25 + uVar20);
    lVar10 = SUB168(SEXT816((long)uStack_2e0) * SEXT816((long)psVar25),8) + ((long)psVar16 >> 0x3e)
             + (ulong)CARRY8(uStack_2e0 * (long)psVar25,uVar20);
    uVar6 = (long)psStack_2d0 * uVar7;
    lVar12 = SUB168(SEXT816((long)psStack_2d0) * SEXT816((long)uVar7),8);
    psVar27 = psStack_2d0;
    auStack_2b0._0_8_ = uStack_2d8;
    auStack_260._0_8_ = psStack_280;
    if (-1 < lVar12) {
      psVar16 = (secp256k1_gej *)(-1 - uVar6);
      lVar23 = (0x7fffffffffffffff - lVar12) - lVar10;
      if ((SBORROW8(0x7fffffffffffffff - lVar12,lVar10) !=
          SBORROW8(lVar23,(ulong)(psVar16 < psVar17))) ==
          (long)(lVar23 - (ulong)(psVar16 < psVar17)) < 0) goto LAB_0014c47c;
      goto LAB_0014c9ab;
    }
    lVar22 = (-0x8000000000000000 - lVar12) - (ulong)(uVar6 != 0);
    lVar23 = lVar10 - lVar22;
    psVar16 = (secp256k1_gej *)(lVar23 - (ulong)(psVar17 < (secp256k1_gej *)-uVar6));
    if ((SBORROW8(lVar10,lVar22) != SBORROW8(lVar23,(ulong)(psVar17 < (secp256k1_gej *)-uVar6))) !=
        (long)psVar16 < 0) goto LAB_0014c9ab;
LAB_0014c47c:
    uVar18 = uVar9 + uVar11 >> 0x3e | (long)psVar14 * 4;
    puVar19 = (uint64_t *)((long)(psVar17->x).n + uVar6);
    lVar10 = lVar10 + lVar12 + (ulong)CARRY8((ulong)psVar17,uVar6);
    psVar17 = (secp256k1_gej *)(uStack_2e0 * uVar26 + uVar18);
    psVar16 = (secp256k1_gej *)
              (SUB168(SEXT816((long)uStack_2e0) * SEXT816((long)uVar26),8) + ((long)psVar14 >> 0x3e)
              + (ulong)CARRY8(uStack_2e0 * uVar26,uVar18));
    uVar6 = (long)psStack_2d0 * (long)psStack_308;
    lVar12 = SUB168(SEXT816((long)psStack_2d0) * SEXT816((long)psStack_308),8);
    if (-1 < lVar12) {
      psVar14 = (secp256k1_gej *)(-1 - uVar6);
      lVar23 = (0x7fffffffffffffff - lVar12) - (long)psVar16;
      if ((SBORROW8(0x7fffffffffffffff - lVar12,(long)psVar16) !=
          SBORROW8(lVar23,(ulong)(psVar14 < psVar17))) ==
          (long)(lVar23 - (ulong)(psVar14 < psVar17)) < 0) goto LAB_0014c4eb;
      goto LAB_0014c9b0;
    }
    lVar22 = (-0x8000000000000000 - lVar12) - (ulong)(uVar6 != 0);
    lVar23 = (long)psVar16 - lVar22;
    psVar14 = (secp256k1_gej *)(lVar23 - (ulong)(psVar17 < (secp256k1_gej *)-uVar6));
    if ((SBORROW8((long)psVar16,lVar22) !=
        SBORROW8(lVar23,(ulong)(psVar17 < (secp256k1_gej *)-uVar6))) != (long)psVar14 < 0)
    goto LAB_0014c9b0;
LAB_0014c4eb:
    puVar21 = (uint64_t *)((long)(psVar17->x).n + uVar6);
    psVar16 = (secp256k1_gej *)((long)(psVar16->x).n + (ulong)CARRY8((ulong)psVar17,uVar6) + lVar12)
    ;
    uVar6 = lVar10 * 4 | (ulong)puVar19 >> 0x3e;
    auStack_2b0._8_8_ = (ulong)puVar19 & 0x3fffffffffffffff;
    psVar27 = (secp256k1_modinv64_modinfo *)((ulong)puVar21 & 0x3fffffffffffffff);
    uVar18 = uStack_2b8 * (long)psVar25 + uVar6;
    psVar14 = (secp256k1_gej *)
              (SUB168(SEXT816((long)uStack_2b8) * SEXT816((long)psVar25),8) + (lVar10 >> 0x3e) +
              (ulong)CARRY8(uStack_2b8 * (long)psVar25,uVar6));
    uVar6 = uStack_2e8 * uVar7;
    lVar10 = SUB168(SEXT816((long)uStack_2e8) * SEXT816((long)uVar7),8);
    auStack_260._8_8_ = psVar27;
    if (-1 < lVar10) {
      uVar9 = (ulong)(-uVar6 - 1 < uVar18);
      lVar12 = (0x7fffffffffffffff - lVar10) - (long)psVar14;
      if ((SBORROW8(0x7fffffffffffffff - lVar10,(long)psVar14) != SBORROW8(lVar12,uVar9)) ==
          (long)(lVar12 - uVar9) < 0) goto LAB_0014c57d;
      goto LAB_0014c9b5;
    }
    lVar23 = (-0x8000000000000000 - lVar10) - (ulong)(uVar6 != 0);
    lVar12 = (long)psVar14 - lVar23;
    if ((SBORROW8((long)psVar14,lVar23) != SBORROW8(lVar12,(ulong)(uVar18 < -uVar6))) !=
        (long)(lVar12 - (ulong)(uVar18 < -uVar6)) < 0) goto LAB_0014c9b5;
LAB_0014c57d:
    uVar9 = (ulong)puVar21 >> 0x3e | (long)psVar16 * 4;
    psVar14 = (secp256k1_gej *)((long)(psVar14->x).n + (ulong)CARRY8(uVar18,uVar6) + lVar10);
    psVar17 = (secp256k1_gej *)(uStack_2b8 * uVar26 + uVar9);
    lVar10 = SUB168(SEXT816((long)uStack_2b8) * SEXT816((long)uVar26),8) + ((long)psVar16 >> 0x3e) +
             (ulong)CARRY8(uStack_2b8 * uVar26,uVar9);
    uVar9 = uStack_2e8 * (long)psStack_308;
    lVar12 = SUB168(SEXT816((long)uStack_2e8) * SEXT816((long)psStack_308),8);
    if (-1 < lVar12) {
      psVar16 = (secp256k1_gej *)(-1 - uVar9);
      lVar23 = (0x7fffffffffffffff - lVar12) - lVar10;
      if ((SBORROW8(0x7fffffffffffffff - lVar12,lVar10) !=
          SBORROW8(lVar23,(ulong)(psVar16 < psVar17))) ==
          (long)(lVar23 - (ulong)(psVar16 < psVar17)) < 0) goto LAB_0014c5f5;
      goto LAB_0014c9ba;
    }
    lVar22 = (-0x8000000000000000 - lVar12) - (ulong)(uVar9 != 0);
    lVar23 = lVar10 - lVar22;
    psVar16 = (secp256k1_gej *)(lVar23 - (ulong)(psVar17 < (secp256k1_gej *)-uVar9));
    if ((SBORROW8(lVar10,lVar22) != SBORROW8(lVar23,(ulong)(psVar17 < (secp256k1_gej *)-uVar9))) !=
        (long)psVar16 < 0) goto LAB_0014c9ba;
LAB_0014c5f5:
    puVar19 = (uint64_t *)((long)(psVar17->x).n + uVar9);
    lVar10 = lVar10 + lVar12 + (ulong)CARRY8((ulong)psVar17,uVar9);
    uVar9 = (long)psVar14 * 4 | uVar18 + uVar6 >> 0x3e;
    auStack_2b0._16_8_ = uVar18 + uVar6 & 0x3fffffffffffffff;
    psStack_2d0 = (secp256k1_modinv64_modinfo *)((ulong)puVar19 & 0x3fffffffffffffff);
    auVar30 = SEXT816((long)psVar25);
    uVar6 = uStack_2f8 * (long)psVar25;
    psVar25 = (secp256k1_gej *)(uVar6 + uVar9);
    psVar16 = (secp256k1_gej *)
              (SUB168(SEXT816((long)uStack_2f8) * auVar30,8) + ((long)psVar14 >> 0x3e) +
              (ulong)CARRY8(uVar6,uVar9));
    uVar6 = (long)psStack_2f0 * uVar7;
    lVar12 = SUB168(SEXT816((long)psStack_2f0) * SEXT816((long)uVar7),8);
    if (lVar12 < 0) {
      lVar22 = (-0x8000000000000000 - lVar12) - (ulong)(uVar6 != 0);
      lVar23 = (long)psVar16 - lVar22;
      bVar29 = SBORROW8((long)psVar16,lVar22) !=
               SBORROW8(lVar23,(ulong)(psVar25 < (secp256k1_gej *)-uVar6));
      psVar14 = (secp256k1_gej *)(lVar23 - (ulong)(psVar25 < (secp256k1_gej *)-uVar6));
      psVar17 = psVar14;
    }
    else {
      psVar14 = (secp256k1_gej *)(-1 - uVar6);
      lVar23 = (0x7fffffffffffffff - lVar12) - (long)psVar16;
      bVar29 = SBORROW8(0x7fffffffffffffff - lVar12,(long)psVar16) !=
               SBORROW8(lVar23,(ulong)(psVar14 < psVar25));
      psVar17 = (secp256k1_gej *)(lVar23 - (ulong)(psVar14 < psVar25));
    }
    auStack_260._16_8_ = psStack_2d0;
    if (bVar29 != (long)psVar17 < 0) goto LAB_0014c9bf;
    uVar7 = (ulong)puVar19 >> 0x3e | lVar10 * 4;
    puVar19 = (uint64_t *)((long)(psVar25->x).n + uVar6);
    psVar16 = (secp256k1_gej *)((long)(psVar16->x).n + (ulong)CARRY8((ulong)psVar25,uVar6) + lVar12)
    ;
    psVar25 = (secp256k1_gej *)(uStack_2f8 * uVar26 + uVar7);
    psVar14 = (secp256k1_gej *)
              (SUB168(SEXT816((long)uStack_2f8) * SEXT816((long)uVar26),8) + (lVar10 >> 0x3e) +
              (ulong)CARRY8(uStack_2f8 * uVar26,uVar7));
    uVar7 = (long)psStack_2f0 * (long)psStack_308;
    lVar10 = SUB168(SEXT816((long)psStack_2f0) * SEXT816((long)psStack_308),8);
    psStack_2c0 = psVar27;
    if (-1 < lVar10) {
      uVar6 = (ulong)((secp256k1_gej *)(-1 - uVar7) < psVar25);
      lVar12 = (0x7fffffffffffffff - lVar10) - (long)psVar14;
      if ((SBORROW8(0x7fffffffffffffff - lVar10,(long)psVar14) != SBORROW8(lVar12,uVar6)) ==
          (long)(lVar12 - uVar6) < 0) goto LAB_0014c73d;
      goto LAB_0014c9c4;
    }
    lVar23 = (-0x8000000000000000 - lVar10) - (ulong)(uVar7 != 0);
    lVar12 = (long)psVar14 - lVar23;
    if ((SBORROW8((long)psVar14,lVar23) !=
        SBORROW8(lVar12,(ulong)(psVar25 < (secp256k1_gej *)-uVar7))) !=
        (long)(lVar12 - (ulong)(psVar25 < (secp256k1_gej *)-uVar7)) < 0) goto LAB_0014c9c4;
LAB_0014c73d:
    psVar17 = (secp256k1_gej *)auStack_2b0;
    bVar29 = CARRY8((ulong)psVar25,uVar7);
    psVar25 = (secp256k1_gej *)((long)(psVar25->x).n + uVar7);
    psVar14 = (secp256k1_gej *)((long)(psVar14->x).n + (ulong)bVar29 + lVar10);
    uVar7 = (long)psVar16 * 4 | (ulong)puVar19 >> 0x3e;
    uVar6 = (ulong)puVar19 & 0x3fffffffffffffff;
    uStack_2e8 = (ulong)psVar25 & 0x3fffffffffffffff;
    psVar16 = (secp256k1_gej *)(((long)psVar16 >> 0x3e) + -1 + (ulong)(0x7fffffffffffffff < uVar7));
    uStack_2e0 = auStack_2b0._16_8_;
    uStack_2c8 = auStack_2b0._8_8_;
    auStack_2b0._24_8_ = uVar6;
    auStack_260._24_8_ = uStack_2e8;
    if (psVar16 != (secp256k1_gej *)0xffffffffffffffff) goto LAB_0014c9c9;
    psVar25 = (secp256k1_gej *)((ulong)psVar25 >> 0x3e | (long)psVar14 * 4);
    psVar14 = (secp256k1_gej *)
              (((long)psVar14 >> 0x3e) + -1 + (ulong)((secp256k1_gej *)0x7fffffffffffffff < psVar25)
              );
    auStack_2b0._32_8_ = uVar7;
    if (psVar14 != (secp256k1_gej *)0xffffffffffffffff) goto LAB_0014c9ce;
    psVar14 = (secp256k1_gej *)0x5;
    psStack_318 = (secp256k1_modinv64_modinfo *)0x14c7d2;
    psVar16 = psVar17;
    uStack_2f8 = uVar7;
    auStack_260._32_8_ = psVar25;
    iVar4 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar17,5,&psStack_300->modulus,-1);
    if (iVar4 < 1) goto LAB_0014c9d3;
    psVar14 = (secp256k1_gej *)0x5;
    psStack_318 = (secp256k1_modinv64_modinfo *)0x14c7ef;
    iVar4 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar17,5,&modinfo->modulus,1);
    if (0 < iVar4) goto LAB_0014c9d8;
    psVar16 = (secp256k1_gej *)auStack_260;
    psVar14 = (secp256k1_gej *)0x5;
    psStack_318 = (secp256k1_modinv64_modinfo *)0x14c816;
    psVar17 = psVar16;
    iVar4 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar16,5,&modinfo->modulus,-1);
    if (iVar4 < 1) goto LAB_0014c9dd;
    psVar14 = (secp256k1_gej *)0x5;
    psStack_318 = (secp256k1_modinv64_modinfo *)0x14c833;
    iVar4 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar16,5,&modinfo->modulus,1);
    if (-1 < iVar4) goto LAB_0014c9e2;
    uVar5 = (int)uStack_278 + 1;
    uVar9 = (ulong)uVar5;
    psVar27 = psStack_280;
    uVar18 = uStack_2d8;
    psStack_2f0 = psVar25;
  } while (uVar5 != 10);
  psVar16 = (secp256k1_gej *)auStack_260;
  psVar14 = (secp256k1_gej *)0x5;
  psStack_318 = (secp256k1_modinv64_modinfo *)0x14c87d;
  iVar4 = secp256k1_modinv64_mul_cmp_62
                    ((secp256k1_modinv64_signed62 *)psVar16,5,&SECP256K1_SIGNED62_ONE,0);
  if (iVar4 != 0) {
LAB_0014c9f1:
    psStack_318 = (secp256k1_modinv64_modinfo *)0x14c9f6;
    secp256k1_modinv64_cold_6();
LAB_0014c9f6:
    psStack_318 = (secp256k1_modinv64_modinfo *)0x14c9fb;
    secp256k1_modinv64_cold_7();
LAB_0014c9fb:
    psStack_318 = (secp256k1_modinv64_modinfo *)secp256k1_eckey_pubkey_tweak_add;
    secp256k1_modinv64_cold_3();
    uStack_328 = uVar13;
    psStack_320 = psVar25;
    psStack_318 = modinfo;
    secp256k1_gej_set_ge(&sStack_c90,(secp256k1_ge *)psVar16);
    sStack_ca8.aux = asStack_bf8;
    sStack_ca8.pre_a = asStack_a78;
    sStack_ca8.ps = &sStack_738;
    secp256k1_ecmult_strauss_wnaf
              (&sStack_ca8,&sStack_c90,1,&sStack_c90,&secp256k1_scalar_one,
               (secp256k1_scalar *)psVar14);
    secp256k1_gej_verify(&sStack_c90);
    if (sStack_c90.infinity == 0) {
      secp256k1_ge_set_gej((secp256k1_ge *)psVar16,&sStack_c90);
    }
    return;
  }
  psStack_318 = (secp256k1_modinv64_modinfo *)0x14c8a2;
  iVar4 = secp256k1_modinv64_mul_cmp_62
                    ((secp256k1_modinv64_signed62 *)auStack_2b0,5,&SECP256K1_SIGNED62_ONE,-1);
  psVar25 = (secp256k1_gej *)auStack_2b0._40_8_;
  if (iVar4 != 0) {
    psStack_318 = (secp256k1_modinv64_modinfo *)0x14c8c9;
    iVar4 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)auStack_2b0,5,&SECP256K1_SIGNED62_ONE,1);
    if (iVar4 != 0) {
      psVar14 = (secp256k1_gej *)0x5;
      psStack_318 = (secp256k1_modinv64_modinfo *)0x14c8e3;
      psVar16 = psVar25;
      iVar4 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)psVar25,5,&SECP256K1_SIGNED62_ONE,0);
      if (iVar4 == 0) {
        psVar16 = (secp256k1_gej *)auStack_210;
        psVar14 = (secp256k1_gej *)0x5;
        psStack_318 = (secp256k1_modinv64_modinfo *)0x14c906;
        iVar4 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)psVar16,5,&SECP256K1_SIGNED62_ONE,0);
        if (iVar4 == 0) {
          psVar16 = (secp256k1_gej *)auStack_2b0;
          psVar14 = (secp256k1_gej *)0x5;
          psStack_318 = (secp256k1_modinv64_modinfo *)0x14c925;
          iVar4 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)psVar16,5,&modinfo->modulus,1);
          if (iVar4 == 0) goto LAB_0014c92d;
        }
      }
      goto LAB_0014c9f6;
    }
  }
LAB_0014c92d:
  psStack_318 = (secp256k1_modinv64_modinfo *)0x14c945;
  secp256k1_modinv64_normalize_62((secp256k1_modinv64_signed62 *)auStack_210,uStack_2f8,modinfo);
  (psVar25->x).n[4] = auStack_210._32_8_;
  (psVar25->x).n[2] = auStack_210._16_8_;
  (psVar25->x).n[3] = auStack_210._24_8_;
  (psVar25->x).n[0] = auStack_210._0_8_;
  (psVar25->x).n[1] = auStack_210._8_8_;
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_cmov(secp256k1_fe *r, const secp256k1_fe *a, int flag) {
    VERIFY_CHECK(flag == 0 || flag == 1);
    SECP256K1_FE_VERIFY(a);
    SECP256K1_FE_VERIFY(r);

    secp256k1_fe_impl_cmov(r, a, flag);
    if (a->magnitude > r->magnitude) r->magnitude = a->magnitude;
    if (!a->normalized) r->normalized = 0;

    SECP256K1_FE_VERIFY(r);
}